

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_face_build_cmaps(TT_Face face)

{
  byte *pbVar1;
  FT_CMap_Class clazz_00;
  uint uVar2;
  int iVar3;
  FT_Error FVar4;
  TT_CMap_Class in_RAX;
  FT_CMap base;
  TT_CMap_Class limit;
  undefined1 local_160 [8];
  TT_ValidatorRec valid;
  FT_CMap ttcmap;
  FT_CharMapRec charmap;
  FT_UInt format;
  TT_CMap_Class clazz;
  TT_CMap_Class *pclazz;
  FT_UInt num_cmaps;
  FT_Error error;
  FT_Byte *cmap;
  FT_Byte *p;
  
  pbVar1 = face->cmap_table;
  limit = (TT_CMap_Class)(pbVar1 + face->cmap_size);
  if (((pbVar1 != (byte *)0x0) && (in_RAX = (TT_CMap_Class)(pbVar1 + 4), in_RAX <= limit)) &&
     (in_RAX = (TT_CMap_Class)((ulong)*pbVar1 << 8), pbVar1[1] == 0 && (int)in_RAX == 0)) {
    clazz = (TT_CMap_Class)((ulong)pbVar1[2] << 8);
    pclazz._0_4_ = (uint)pbVar1[3] | (uint)clazz;
    cmap = pbVar1 + 4;
    while ((in_RAX = clazz, (uint)pclazz != 0 &&
           (in_RAX = (TT_CMap_Class)(cmap + 8), in_RAX <= limit))) {
      charmap.face._4_2_ = CONCAT11(*cmap,cmap[1]);
      charmap.face._6_2_ = CONCAT11(cmap[2],cmap[3]);
      charmap.face._0_4_ = 0;
      uVar2 = (uint)cmap[7] | (uint)cmap[6] << 8 | (uint)cmap[5] << 0x10 | (uint)cmap[4] << 0x18;
      clazz = (TT_CMap_Class)(ulong)uVar2;
      if ((uVar2 != 0) && (clazz <= (TT_CMap_Class)(face->cmap_size - 2))) {
        base = (FT_CMap)(pbVar1 + (long)&clazz->clazz);
        charmap._12_4_ =
             ZEXT24(CONCAT11(*(undefined1 *)&(base->charmap).face,
                             *(undefined1 *)((long)&(base->charmap).face + 1)));
        for (clazz = (TT_CMap_Class)tt_cmap_classes; (clazz->clazz).size != 0;
            clazz = (TT_CMap_Class)&(clazz->clazz).init) {
          clazz_00 = (FT_CMap_Class)(clazz->clazz).size;
          if ((uint)clazz_00[1].size == charmap._12_4_) {
            pclazz._4_4_ = 0;
            ttcmap = (FT_CMap)face;
            ft_validator_init((FT_Validator)local_160,(FT_Byte *)base,(FT_Byte *)limit,
                              FT_VALIDATE_DEFAULT);
            valid.validator.level = (FT_ValidationLevel)(face->max_profile).numGlyphs;
            iVar3 = _setjmp((__jmp_buf_tag *)local_160);
            if (iVar3 == 0) {
              pclazz._4_4_ = (*clazz_00[1].init)(base,(FT_Validator)local_160);
            }
            if ((valid.validator.limit._4_4_ == 0) &&
               (FVar4 = FT_CMap_New(clazz_00,base,(FT_CharMap)&ttcmap,
                                    (FT_CMap_conflict *)&valid.num_glyphs), FVar4 == 0)) {
              *(FT_Error *)(valid._224_8_ + 0x20) = pclazz._4_4_;
            }
            break;
          }
        }
      }
      pclazz._0_4_ = (uint)pclazz - 1;
      cmap = cmap + 8;
    }
  }
  return (FT_Error)in_RAX;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_build_cmaps( TT_Face  face )
  {
    FT_Byte*           table = face->cmap_table;
    FT_Byte*           limit = table + face->cmap_size;
    FT_UInt volatile   num_cmaps;
    FT_Byte* volatile  p     = table;
    FT_Library         library = FT_FACE_LIBRARY( face );

    FT_UNUSED( library );


    if ( !p || p + 4 > limit )
      return FT_THROW( Invalid_Table );

    /* only recognize format 0 */
    if ( TT_NEXT_USHORT( p ) != 0 )
    {
      FT_ERROR(( "tt_face_build_cmaps:"
                 " unsupported `cmap' table format = %d\n",
                 TT_PEEK_USHORT( p - 2 ) ));
      return FT_THROW( Invalid_Table );
    }

    num_cmaps = TT_NEXT_USHORT( p );

    for ( ; num_cmaps > 0 && p + 8 <= limit; num_cmaps-- )
    {
      FT_CharMapRec  charmap;
      FT_UInt32      offset;


      charmap.platform_id = TT_NEXT_USHORT( p );
      charmap.encoding_id = TT_NEXT_USHORT( p );
      charmap.face        = FT_FACE( face );
      charmap.encoding    = FT_ENCODING_NONE;  /* will be filled later */
      offset              = TT_NEXT_ULONG( p );

      if ( offset && offset <= face->cmap_size - 2 )
      {
        FT_Byte* volatile              cmap   = table + offset;
        volatile FT_UInt               format = TT_PEEK_USHORT( cmap );
        const TT_CMap_Class* volatile  pclazz = TT_CMAP_CLASSES_GET;
        TT_CMap_Class volatile         clazz;


        for ( ; *pclazz; pclazz++ )
        {
          clazz = *pclazz;
          if ( clazz->format == format )
          {
            volatile TT_ValidatorRec  valid;
            volatile FT_Error         error = FT_Err_Ok;


            ft_validator_init( FT_VALIDATOR( &valid ), cmap, limit,
                               FT_VALIDATE_DEFAULT );

            valid.num_glyphs = (FT_UInt)face->max_profile.numGlyphs;

            if ( ft_setjmp( FT_VALIDATOR( &valid )->jump_buffer) == 0 )
            {
              /* validate this cmap sub-table */
              error = clazz->validate( cmap, FT_VALIDATOR( &valid ) );
            }

            if ( !valid.validator.error )
            {
              FT_CMap  ttcmap;


              /* It might make sense to store the single variation         */
              /* selector cmap somewhere special.  But it would have to be */
              /* in the public FT_FaceRec, and we can't change that.       */

              if ( !FT_CMap_New( (FT_CMap_Class)clazz,
                                 cmap, &charmap, &ttcmap ) )
              {
                /* it is simpler to directly set `flags' than adding */
                /* a parameter to FT_CMap_New                        */
                ((TT_CMap)ttcmap)->flags = (FT_Int)error;
              }
            }
            else
            {
              FT_TRACE0(( "tt_face_build_cmaps:"
                          " broken cmap sub-table ignored\n" ));
            }
            break;
          }
        }

        if ( !*pclazz )
        {
          FT_TRACE0(( "tt_face_build_cmaps:"
                      " unsupported cmap sub-table ignored\n" ));
        }
      }
    }

    return FT_Err_Ok;
  }